

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mcrxr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  ret_01 = tcg_temp_new_i32(tcg_ctx);
  ret = *(TCGv_i32 *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38));
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx,ret_00,cpu_so);
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx,ret_01,cpu_ov);
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx,ret,cpu_ca);
  tcg_gen_shli_i32_ppc64(tcg_ctx,ret_00,ret_00,3);
  tcg_gen_shli_i32_ppc64(tcg_ctx,ret_01,ret_01,2);
  tcg_gen_shli_i32_ppc64(tcg_ctx,ret,ret,1);
  tcg_gen_or_i32(tcg_ctx,ret,ret,ret_00);
  tcg_gen_or_i32(tcg_ctx,ret,ret,ret_01);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_gen_movi_i64_ppc64(tcg_ctx,cpu_so,0);
  tcg_gen_movi_i64_ppc64(tcg_ctx,cpu_ov,0);
  tcg_gen_movi_i64_ppc64(tcg_ctx,cpu_ca,0);
  return;
}

Assistant:

static void gen_mcrxr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 dst = cpu_crf[crfD(ctx->opcode)];

    tcg_gen_trunc_tl_i32(tcg_ctx, t0, cpu_so);
    tcg_gen_trunc_tl_i32(tcg_ctx, t1, cpu_ov);
    tcg_gen_trunc_tl_i32(tcg_ctx, dst, cpu_ca);
    tcg_gen_shli_i32(tcg_ctx, t0, t0, 3);
    tcg_gen_shli_i32(tcg_ctx, t1, t1, 2);
    tcg_gen_shli_i32(tcg_ctx, dst, dst, 1);
    tcg_gen_or_i32(tcg_ctx, dst, dst, t0);
    tcg_gen_or_i32(tcg_ctx, dst, dst, t1);
    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);

    tcg_gen_movi_tl(tcg_ctx, cpu_so, 0);
    tcg_gen_movi_tl(tcg_ctx, cpu_ov, 0);
    tcg_gen_movi_tl(tcg_ctx, cpu_ca, 0);
}